

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTim.c
# Opt level: O1

Vec_Flt_t * Abc_NtkTestCreateRequired(int nOutputs)

{
  uint uVar1;
  Vec_Flt_t *pVVar2;
  float *pfVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  
  pVVar2 = (Vec_Flt_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < nOutputs - 1U) {
    iVar4 = nOutputs;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = iVar4;
  if (iVar4 == 0) {
    pfVar3 = (float *)0x0;
  }
  else {
    pfVar3 = (float *)malloc((long)iVar4 << 2);
  }
  pVVar2->pArray = pfVar3;
  if (0 < nOutputs) {
    lVar7 = (long)pVVar2->nSize;
    uVar5 = pVVar2->nCap;
    pfVar3 = pVVar2->pArray;
    uVar6 = 100;
    do {
      if ((uint)lVar7 == uVar5) {
        if ((int)uVar5 < 0x10) {
          if (pfVar3 == (float *)0x0) {
            pfVar3 = (float *)malloc(0x40);
          }
          else {
            pfVar3 = (float *)realloc(pfVar3,0x40);
          }
          uVar5 = 0x10;
        }
        else {
          uVar1 = uVar5 * 2;
          if (SBORROW4(uVar5,uVar1) != 0 < (int)uVar5) {
            uVar5 = uVar1;
            if (pfVar3 == (float *)0x0) {
              pfVar3 = (float *)malloc((ulong)uVar1 << 2);
            }
            else {
              pfVar3 = (float *)realloc(pfVar3,(ulong)uVar1 << 2);
            }
          }
        }
      }
      pfVar3[lVar7] = (float)uVar6;
      lVar7 = lVar7 + 1;
      iVar4 = uVar6 - nOutputs;
      uVar6 = uVar6 + 1;
    } while (iVar4 != 99);
    pVVar2->nSize = (int)lVar7;
    pVVar2->nCap = uVar5;
    pVVar2->pArray = pfVar3;
  }
  return pVVar2;
}

Assistant:

Vec_Flt_t * Abc_NtkTestCreateRequired( int nOutputs )
{
    Vec_Flt_t * p;
    int i;
    p = Vec_FltAlloc( nOutputs );
    for ( i = 0; i < nOutputs; i++ )
        Vec_FltPush( p, 100.0 + 1.0*i );
    return p;
}